

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgemm.hpp
# Opt level: O0

void remora::bindings::ugemm<remora::bindings::syrk_block_size<double>,double,double>
               (size_t kc,double alpha,double *A,double *B,double *C,size_t stride1,size_t stride2)

{
  long in_RCX;
  long lVar1;
  long in_RDX;
  long in_RSI;
  ulong in_RDI;
  long in_R8;
  long in_R9;
  double in_XMM0_Qa;
  size_t j_2;
  size_t i_2;
  double *p;
  size_t j_1;
  size_t i_1;
  size_t j;
  size_t i;
  size_t l;
  vx *b;
  size_t c;
  double *P;
  type Pa;
  ulong local_218;
  ulong local_210;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  long local_1d8;
  ulong local_1d0;
  double local_1c0 [43];
  long local_68;
  
  for (local_1d0 = 0; local_1d0 < 0x20; local_1d0 = local_1d0 + 1) {
    local_1c0[local_1d0] = 0.0;
  }
  local_1d8 = in_RDX;
  local_68 = in_RSI;
  for (local_1e0 = 0; local_1e0 < in_RDI; local_1e0 = local_1e0 + 1) {
    for (local_1e8 = 0; local_1e8 < 4; local_1e8 = local_1e8 + 1) {
      for (local_1f0 = 0; local_1f0 < 8; local_1f0 = local_1f0 + 1) {
        lVar1 = local_1e8 * 8 + local_1f0;
        local_1c0[lVar1] =
             *(double *)(local_68 + local_1e8 * 8) * *(double *)(local_1d8 + local_1f0 * 8) +
             local_1c0[lVar1];
      }
    }
    local_68 = local_68 + 0x20;
    local_1d8 = local_1d8 + 0x40;
  }
  if ((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) {
    for (local_1f8 = 0; local_1f8 < 4; local_1f8 = local_1f8 + 1) {
      for (local_200 = 0; local_200 < 8; local_200 = local_200 + 1) {
        lVar1 = local_1f8 * 8 + local_200;
        local_1c0[lVar1] = in_XMM0_Qa * local_1c0[lVar1];
      }
    }
  }
  for (local_210 = 0; local_210 < 4; local_210 = local_210 + 1) {
    for (local_218 = 0; local_218 < 8; local_218 = local_218 + 1) {
      lVar1 = local_210 * in_R8 + local_218 * in_R9;
      *(double *)(in_RCX + lVar1 * 8) =
           local_1c0[local_210 * 8 + local_218] + *(double *)(in_RCX + lVar1 * 8);
    }
  }
  return;
}

Assistant:

void ugemm(
	std::size_t kc, TC alpha, T const* A, T const* B,
	TC* C, std::size_t stride1, std::size_t stride2
){
	BOOST_ALIGN_ASSUME_ALIGNED(A, block_size::block::align);
	BOOST_ALIGN_ASSUME_ALIGNED(B, block_size::block::align);

	typedef typename block_size::block::type vx;
	static const std::size_t vector_length = block_size::block::vector_elements;
	static const std::size_t vecNR = block_size::nr/vector_length;
#ifdef REMORA_USE_SIMD
	vx P[block_size::mr * vecNR] = {};
#else
	typename std::aligned_storage<sizeof(vx[block_size::mr*vecNR]),block_size::block::align>::type Pa;
	T* P = reinterpret_cast<T*>(&Pa);
	for (std::size_t c = 0; c < block_size::mr*vecNR; c++)
		P[c] = 0;
#endif


	// perform the matrix-matrix product as outer product
	// of rows of A and B
	vx const* b = (vx const*)B;
	for (std::size_t l=0; l<kc; ++l) {
		for (std::size_t i=0; i<block_size::mr; ++i) {
			for (std::size_t j=0; j<vecNR; ++j) {
				P[i * vecNR+j] += A[i]*b[j];
			}
		}
		A += block_size::mr;
		b += vecNR;
	}
	//multiply with alpha if necessary
	if (alpha!=TC(1)) {
		for (std::size_t i=0; i<block_size::mr; ++i) {
			for (std::size_t j=0; j< vecNR; ++j) {
				P[i*vecNR+j] *= alpha;
			}
		}
	}

	//add result to C
	T const* p = (T const*) P;
	for (std::size_t i=0; i<block_size::mr; ++i) {
		for (std::size_t j=0; j<block_size::nr; ++j) {
			C[i * stride1+j * stride2] += p[i*block_size::nr+j];
		}
	}
}